

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_lobster.cpp
# Opt level: O2

void __thiscall
flatbuffers::lobster::LobsterGenerator::CheckNameSpace
          (LobsterGenerator *this,Definition *def,string *code_ptr)

{
  __type _Var1;
  string ns;
  string sStack_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  BaseGenerator::GetNameSpace_abi_cxx11_(&sStack_78,&this->super_BaseGenerator,def);
  _Var1 = std::operator==(&sStack_78,&this->current_namespace_);
  if (!_Var1) {
    std::__cxx11::string::_M_assign((string *)&this->current_namespace_);
    std::operator+(&local_58,"namespace ",&sStack_78);
    std::operator+(&local_38,&local_58,"\n\n");
    std::__cxx11::string::append((string *)code_ptr);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_58);
  }
  std::__cxx11::string::~string((string *)&sStack_78);
  return;
}

Assistant:

void CheckNameSpace(const Definition &def, std::string *code_ptr) {
    auto ns = GetNameSpace(def);
    if (ns == current_namespace_) return;
    current_namespace_ = ns;
    std::string &code = *code_ptr;
    code += "namespace " + ns + "\n\n";
  }